

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.hpp
# Opt level: O1

void __thiscall
deqp::egl::NamedFilterList::NamedFilterList(NamedFilterList *this,char *name,char *description)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  (this->super_FilterList).m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FilterList).m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_FilterList).m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,description,&local_12);
  return;
}

Assistant:

NamedFilterList		(const char* name, const char* description) : m_name(name), m_description(description) {}